

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O3

u8 * write_varint(u32 value,u8 *dst_begin,u8 *dst_max_end)

{
  u8 *puVar1;
  sbyte sVar2;
  u32 uVar3;
  u8 *dst;
  byte *pbVar4;
  long lVar5;
  
  if (value < 0x80) {
    puVar1 = dst_begin + 1;
    if (dst_max_end < puVar1) {
      return (u8 *)0x0;
    }
  }
  else {
    if (value < 0x4000) {
      puVar1 = dst_begin + 2;
      if (dst_max_end < puVar1) {
        return (u8 *)0x0;
      }
      sVar2 = 7;
      lVar5 = 1;
      pbVar4 = dst_begin;
      uVar3 = value;
    }
    else {
      if (0x1fffff < value) {
        __assert_fail("value < 0x200000",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c"
                      ,0x85,"u8 *write_varint(u32, u8 *, u8 *)");
      }
      puVar1 = dst_begin + 3;
      if (dst_max_end < puVar1) {
        return (u8 *)0x0;
      }
      pbVar4 = dst_begin + 1;
      *dst_begin = (byte)value | 0x80;
      uVar3 = value >> 7;
      sVar2 = 0xe;
      lVar5 = 2;
    }
    dst_begin = dst_begin + lVar5;
    *pbVar4 = (byte)uVar3 | 0x80;
    value = value >> sVar2;
  }
  *dst_begin = (u8)value;
  return puVar1;
}

Assistant:

static u8* write_varint(u32 value, u8* dst_begin, u8* dst_max_end) {
  u8* dst = dst_begin;
  if (value < 0x80) {
    CHECK_WRITE(1, dst, dst_max_end);
    *dst++ = (u8)value;
  } else if (value < 0x4000) {
    CHECK_WRITE(2, dst, dst_max_end);
    *dst++ = 0x80 | (value & 0x7f);
    *dst++ = (value >> 7) & 0x7f;
  } else {
    /* If this fires there is a run of 2Mib. In the current EmulatorState this
     * is impossible. */
    assert(value < 0x200000);
    CHECK_WRITE(3, dst, dst_max_end);
    *dst++ = 0x80 | (value & 0x7f);
    *dst++ = 0x80 | ((value >> 7) & 0x7f);
    *dst++ = (value >> 14) & 0x7f;
  }
  return dst;
}